

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flops.cc
# Opt level: O0

void runAll(void)

{
  undefined1 auStackY_4c0 [8];
  benchmark_12 *in_stack_fffffffffffffb48;
  undefined1 local_460 [8];
  benchmark *in_stack_fffffffffffffba8;
  undefined1 local_400 [96];
  undefined1 local_3a0 [96];
  undefined1 local_340 [96];
  undefined1 local_2e0 [96];
  undefined1 local_280 [96];
  undefined1 local_220 [96];
  undefined1 local_1c0 [96];
  undefined1 local_160 [96];
  undefined1 local_100 [96];
  undefined1 local_a0 [152];
  
  memset(local_a0,0,0x60);
  benchmark_1::benchmark_1((benchmark_1 *)in_stack_fffffffffffffb48);
  bench_kernel(in_stack_fffffffffffffba8);
  memset(local_100,0,0x60);
  benchmark_2::benchmark_2((benchmark_2 *)in_stack_fffffffffffffb48);
  bench_kernel(in_stack_fffffffffffffba8);
  memset(local_160,0,0x60);
  benchmark_3::benchmark_3((benchmark_3 *)in_stack_fffffffffffffb48);
  bench_kernel(in_stack_fffffffffffffba8);
  memset(local_1c0,0,0x60);
  benchmark_4::benchmark_4((benchmark_4 *)in_stack_fffffffffffffb48);
  bench_kernel(in_stack_fffffffffffffba8);
  memset(local_220,0,0x60);
  benchmark_5::benchmark_5((benchmark_5 *)in_stack_fffffffffffffb48);
  bench_kernel(in_stack_fffffffffffffba8);
  memset(local_280,0,0x60);
  benchmark_6::benchmark_6((benchmark_6 *)in_stack_fffffffffffffb48);
  bench_kernel(in_stack_fffffffffffffba8);
  memset(local_2e0,0,0x60);
  benchmark_7::benchmark_7((benchmark_7 *)in_stack_fffffffffffffb48);
  bench_kernel(in_stack_fffffffffffffba8);
  memset(local_340,0,0x60);
  benchmark_8::benchmark_8((benchmark_8 *)in_stack_fffffffffffffb48);
  bench_kernel(in_stack_fffffffffffffba8);
  memset(local_3a0,0,0x60);
  benchmark_9::benchmark_9((benchmark_9 *)in_stack_fffffffffffffb48);
  bench_kernel(in_stack_fffffffffffffba8);
  memset(local_400,0,0x60);
  benchmark_10::benchmark_10((benchmark_10 *)in_stack_fffffffffffffb48);
  bench_kernel(in_stack_fffffffffffffba8);
  memset(local_460,0,0x60);
  benchmark_11::benchmark_11((benchmark_11 *)in_stack_fffffffffffffb48);
  bench_kernel(in_stack_fffffffffffffba8);
  memset(auStackY_4c0,0,0x60);
  benchmark_12::benchmark_12(in_stack_fffffffffffffb48);
  bench_kernel(in_stack_fffffffffffffba8);
  return;
}

Assistant:

void runAll()
{
    bench_kernel(benchmark_1 {});
    bench_kernel(benchmark_2 {});
    bench_kernel(benchmark_3 {});
    bench_kernel(benchmark_4 {});
    bench_kernel(benchmark_5 {});
    bench_kernel(benchmark_6 {});
    bench_kernel(benchmark_7 {});
    bench_kernel(benchmark_8 {});
    bench_kernel(benchmark_9 {});
    bench_kernel(benchmark_10 {});
    bench_kernel(benchmark_11 {});
    bench_kernel(benchmark_12 {});
}